

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

unsigned_long tjBufSize(int width,int height,int jpegSubsamp)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  if ((height < 1 || width < 1) || 5 < (uint)jpegSubsamp) {
    pcVar3 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar3,"tjBufSize(): Invalid argument",0x1e);
    return 0xffffffffffffffff;
  }
  iVar1 = tjMCUWidth[(uint)jpegSubsamp];
  iVar2 = tjMCUHeight[(uint)jpegSubsamp];
  lVar4 = 2;
  if (jpegSubsamp != 3) {
    lVar4 = (long)((int)(0x100 / (long)(iVar2 * iVar1)) + 2);
  }
  return (int)((-iVar2 & (height + iVar2) - 1U) * (-iVar1 & (width + iVar1) - 1U)) * lVar4 + 0x800;
}

Assistant:

DLLEXPORT unsigned long tjBufSize(int width, int height, int jpegSubsamp)
{
  unsigned long long retval = 0;
  int mcuw, mcuh, chromasf;

  if (width < 1 || height < 1 || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT)
    THROWG("tjBufSize(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  mcuw = tjMCUWidth[jpegSubsamp];
  mcuh = tjMCUHeight[jpegSubsamp];
  chromasf = jpegSubsamp == TJSAMP_GRAY ? 0 : 4 * 64 / (mcuw * mcuh);
  retval = PAD(width, mcuw) * PAD(height, mcuh) * (2ULL + chromasf) + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSize(): Image is too large");

bailout:
  return (unsigned long)retval;
}